

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall
QFileSystemModelPrivate::directoryChanged
          (QFileSystemModelPrivate *this,QString *directory,QStringList *files)

{
  QString *args;
  int iVar1;
  QFileSystemNode *parentNode;
  iterator iVar2;
  iterator iVar3;
  pointer pQVar4;
  ulong uVar5;
  Data *pDVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parentNode = node(this,directory,false);
  pDVar6 = (parentNode->children).d;
  if ((pDVar6 == (Data *)0x0) || (pDVar6->size == 0)) goto LAB_00615bde;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_70.d = (files->d).d;
  local_70.ptr = (files->d).ptr;
  local_70.size = (files->d).size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = QList<QString>::begin((QList<QString> *)&local_70);
  iVar3 = QList<QString>::end((QList<QString> *)&local_70);
  if (iVar2.i != iVar3.i) {
    uVar5 = ((long)iVar3.i - (long)iVar2.i >> 3) * -0x5555555555555555;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i);
  }
  pDVar6 = (parentNode->children).d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
    uVar5 = 0;
LAB_00615a76:
    if (pDVar6 != (Data *)0x0 || uVar5 != 0) goto LAB_00615a82;
  }
  else {
    if (pDVar6->spans->offsets[0] == 0xff) {
      uVar8 = 1;
      do {
        uVar5 = uVar8;
        if (pDVar6->numBuckets == uVar5) {
          pDVar6 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar8 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_00615a76;
    }
    uVar5 = 0;
LAB_00615a82:
    do {
      iVar2 = QList<QString>::begin((QList<QString> *)&local_70);
      iVar3 = QList<QString>::end((QList<QString> *)&local_70);
      lVar7 = (uVar5 >> 3 & 0xfffffffffffffff0) * 9;
      uVar8 = (ulong)((uint)uVar5 & 0x7f);
      iVar2 = std::__lower_bound<QList<QString>::iterator,QString,__gnu_cxx::__ops::_Iter_less_val>
                        (iVar2.i,iVar3.i,
                         *(undefined8 *)
                          (*(long *)(pDVar6->spans->offsets + lVar7 + 0x80) + 0x18 +
                          (ulong)pDVar6->spans->offsets[uVar8 + lVar7] * 0x20));
      iVar3 = QList<QString>::end((QList<QString> *)&local_70);
      args = *(QString **)
              (*(long *)(pDVar6->spans->offsets + lVar7 + 0x80) + 0x18 +
              (ulong)pDVar6->spans->offsets[uVar8 + lVar7] * 0x20);
      if ((iVar2.i == iVar3.i) ||
         (QVar9.m_data = (args->d).ptr, QVar9.m_size = (args->d).size,
         QVar10.m_data = ((iVar2.i)->d).ptr, QVar10.m_size = ((iVar2.i)->d).size,
         iVar1 = QtPrivate::compareStrings(QVar9,QVar10,CaseSensitive), iVar1 < 0)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,args);
        QList<QString>::end((QList<QString> *)&local_58);
      }
      do {
        if (pDVar6->numBuckets - 1 == uVar5) {
          pDVar6 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar6 != (Data *)0x0) || (uVar5 != 0));
  }
  if (local_58.size != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      pQVar4 = QList<QString>::data((QList<QString> *)&local_58);
      removeNode(this,parentNode,(QString *)((long)&(pQVar4->d).d + lVar7));
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar5 < (ulong)local_58.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_00615bde:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::directoryChanged(const QString &directory, const QStringList &files)
{
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(directory, false);
    if (parentNode->children.size() == 0)
        return;
    QStringList toRemove;
    QStringList newFiles = files;
    std::sort(newFiles.begin(), newFiles.end());
    for (auto i = parentNode->children.constBegin(), cend = parentNode->children.constEnd(); i != cend; ++i) {
        QStringList::iterator iterator = std::lower_bound(newFiles.begin(), newFiles.end(), i.value()->fileName);
        if ((iterator == newFiles.end()) || (i.value()->fileName < *iterator))
            toRemove.append(i.value()->fileName);
    }
    for (int i = 0 ; i < toRemove.size() ; ++i )
        removeNode(parentNode, toRemove[i]);
}